

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncoderVelocity.cpp
# Opt level: O0

void __thiscall
EncoderVelocity::SetDataOld(EncoderVelocity *this,uint32_t rawPeriod,bool useRunCounter)

{
  ushort local_18;
  uint16_t runCtr;
  bool useRunCounter_local;
  uint32_t rawPeriod_local;
  EncoderVelocity *this_local;
  
  Init(this);
  this->clkPeriod = 1.3020833333333333e-06;
  this->velPeriodMax = 0xffff;
  this->velPeriod = rawPeriod & 0xffff;
  if (this->velPeriod == 0x8000) {
    this->velPeriod = 0x7fff;
    this->velOverflow = true;
  }
  else if ((this->velPeriod & 0x8000) == 0) {
    this->velPeriod = this->velPeriod;
    this->velDir = true;
  }
  else {
    this->velPeriod = this->velPeriod ^ 0xffffffff;
    this->velPeriod = this->velPeriod + 1;
    this->velDir = false;
  }
  if (useRunCounter) {
    local_18 = (ushort)(rawPeriod >> 0x10);
    if (local_18 == 0x8000) {
      this->runOverflow = true;
      local_18 = 0x7fff;
    }
    else if ((rawPeriod & 0x80000000) != 0) {
      local_18 = (local_18 ^ 0xffff) + 1;
    }
    this->runPeriod = (uint)local_18;
  }
  return;
}

Assistant:

void EncoderVelocity::SetDataOld(uint32_t rawPeriod, bool useRunCounter)
{
    Init();
    // Prior to Firmware Version 6, the latched counter value is returned
    // as the lower 16 bits. Starting with Firmware Version 4, the upper 16 bits are
    // the free-running counter, which was not used.
    // Note that the counter values are signed, so we convert to unsigned and set a direction bit
    // to be consistent with later versions of firmware.
    clkPeriod = VEL_PERD_OLD;
    velPeriodMax = ENC_VEL_MASK_16;
    velPeriod = static_cast<uint16_t>(rawPeriod & ENC_VEL_MASK_16);
    // Convert from signed count to unsigned count and direction
    if (velPeriod == 0x8000) { // if overflow
        velPeriod = 0x00007fff;
        velOverflow = true;
        // Firmware also sets velPeriod to overflow when direction change occurred, so could potentially
        // set dirChange = true.
    }
    else if (velPeriod & 0x8000) {  // if negative
        velPeriod = ~velPeriod;     // ones complement (16-bits)
        velPeriod = velPeriod + 1;  // twos complement (32-bits)
        velDir = false;
    }
    else {
        velPeriod = velPeriod;
        velDir = true;
    }
    if (useRunCounter) {
        uint16_t runCtr = static_cast<uint16_t>((rawPeriod>>16) & ENC_VEL_MASK_16);
        // Convert from signed count to unsigned count and direction
        if (runCtr == 0x8000) {  // if overflow
            runOverflow = true;
            runCtr = 0x7fff;
        }
        else if (runCtr & 0x8000) {  // if negative
            runCtr = ~runCtr;        // ones complement (16-bits)
            runCtr += 1;             // twos complement (16-bits)
        }
        runPeriod = static_cast<uint32_t>(runCtr);
    }
}